

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

void re2::FactorAlternationImpl::Round1
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  uint uVar1;
  Rune *pRVar2;
  ulong uVar3;
  ulong uVar4;
  uint nrunes;
  ulong uVar5;
  Rune *runes;
  ulong uVar6;
  ulong uVar7;
  ParseFlags runeflags_i;
  int nrune_i;
  Regexp *prefix;
  ParseFlags local_7c;
  ParseFlags local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  int local_5c;
  vector<re2::Splice,std::allocator<re2::Splice>> *local_58;
  ulong local_50;
  Rune *local_48;
  Regexp **local_40;
  Regexp *local_38;
  
  if (-1 < nsub) {
    uVar7 = (ulong)(uint)nsub;
    uVar5 = (ulong)(nsub + 1);
    uVar6 = 0;
    local_7c = NoParseFlags;
    nrunes = 0;
    runes = (Rune *)0x0;
    uVar4 = 0;
    local_70 = uVar7;
    local_68 = uVar5;
    local_58 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
    do {
      local_74 = 0;
      local_78 = NoParseFlags;
      if (uVar6 < uVar7) {
        pRVar2 = Regexp::LeadingString(sub[uVar6],(int *)&local_74,&local_78);
        uVar5 = local_68;
        uVar7 = local_70;
        if (local_78 != local_7c) goto LAB_001cde75;
        uVar1 = local_74;
        if ((int)nrunes < (int)local_74) {
          uVar1 = nrunes;
        }
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        else {
          uVar3 = 0;
          do {
            if (runes[uVar3] != pRVar2[uVar3]) {
              uVar1 = (uint)uVar3;
              break;
            }
            uVar3 = uVar3 + 1;
          } while (uVar1 != uVar3);
        }
        if (uVar1 == 0) goto LAB_001cde75;
      }
      else {
        pRVar2 = (Rune *)0x0;
LAB_001cde75:
        if (uVar6 != (int)uVar4 + 1 && uVar6 != (uVar4 & 0xffffffff)) {
          local_48 = runes;
          local_38 = Regexp::LiteralString(runes,nrunes,local_7c);
          uVar7 = (ulong)(int)uVar4;
          uVar5 = uVar7;
          local_50 = uVar4;
          if ((long)uVar7 < (long)uVar6) {
            do {
              uVar4 = uVar5 + 1;
              Regexp::RemoveLeadingString(sub[uVar5],nrunes);
              uVar5 = uVar4;
            } while ((uVar4 & 0xffffffff) != uVar6);
          }
          uVar4 = local_50;
          local_40 = sub + uVar7;
          local_5c = (int)uVar6 - (int)local_50;
          std::vector<re2::Splice,std::allocator<re2::Splice>>::
          emplace_back<re2::Regexp*&,re2::Regexp**,int>(local_58,&local_38,&local_40,&local_5c);
          uVar5 = local_68;
          runes = local_48;
          uVar7 = local_70;
        }
        uVar1 = nrunes;
        if (uVar6 < uVar7) {
          local_7c = local_78;
          uVar4 = uVar6 & 0xffffffff;
          runes = pRVar2;
          uVar1 = local_74;
        }
      }
      nrunes = uVar1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round1(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 1: Factor out common literal prefixes.
  int start = 0;
  Rune* rune = NULL;
  int nrune = 0;
  Regexp::ParseFlags runeflags = Regexp::NoParseFlags;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with rune[0:nrune].
    Rune* rune_i = NULL;
    int nrune_i = 0;
    Regexp::ParseFlags runeflags_i = Regexp::NoParseFlags;
    if (i < nsub) {
      rune_i = Regexp::LeadingString(sub[i], &nrune_i, &runeflags_i);
      if (runeflags_i == runeflags) {
        int same = 0;
        while (same < nrune && same < nrune_i && rune[same] == rune_i[same])
          same++;
        if (same > 0) {
          // Matches at least one rune in current range.  Keep going around.
          nrune = same;
          continue;
        }
      }
    }

    // Found end of a run with common leading literal string:
    // sub[start:i] all begin with rune[0:nrune],
    // but sub[i] does not even begin with rune[0].
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = Regexp::LiteralString(rune, nrune, runeflags);
      for (int j = start; j < i; j++)
        Regexp::RemoveLeadingString(sub[j], nrune);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      rune = rune_i;
      nrune = nrune_i;
      runeflags = runeflags_i;
    }
  }
}